

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdjs_elements_transaction.cpp
# Opt level: O2

ElementsAddRawTransactionResponseStruct *
cfd::js::api::ElementsTransactionStructApi::AddRawTransaction
          (ElementsAddRawTransactionResponseStruct *__return_storage_ptr__,
          ElementsAddRawTransactionRequestStruct *request)

{
  string *in_R8;
  allocator local_139;
  _Any_data local_138;
  code *local_128;
  code *local_120;
  function<cfd::js::api::ElementsAddRawTransactionResponseStruct_(const_cfd::js::api::ElementsAddRawTransactionRequestStruct_&)>
  local_110;
  ElementsAddRawTransactionResponseStruct local_f0;
  
  ElementsAddRawTransactionResponseStruct::ElementsAddRawTransactionResponseStruct
            (__return_storage_ptr__);
  local_138._M_unused._M_object = (void *)0x0;
  local_138._8_8_ = 0;
  local_120 = std::
              _Function_handler<cfd::js::api::ElementsAddRawTransactionResponseStruct_(const_cfd::js::api::ElementsAddRawTransactionRequestStruct_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/src/cfdjs_elements_transaction.cpp:213:20)>
              ::_M_invoke;
  local_128 = std::
              _Function_handler<cfd::js::api::ElementsAddRawTransactionResponseStruct_(const_cfd::js::api::ElementsAddRawTransactionRequestStruct_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/src/cfdjs_elements_transaction.cpp:213:20)>
              ::_M_manager;
  std::__cxx11::string::string((string *)&local_110,"AddRawTransaction",&local_139);
  ExecuteStructApi<cfd::js::api::ElementsAddRawTransactionRequestStruct,cfd::js::api::ElementsAddRawTransactionResponseStruct>
            (&local_f0,(api *)request,(ElementsAddRawTransactionRequestStruct *)&local_138,
             &local_110,in_R8);
  ElementsAddRawTransactionResponseStruct::operator=(__return_storage_ptr__,&local_f0);
  ElementsAddRawTransactionResponseStruct::~ElementsAddRawTransactionResponseStruct(&local_f0);
  std::__cxx11::string::~string((string *)&local_110);
  std::_Function_base::~_Function_base((_Function_base *)&local_138);
  return __return_storage_ptr__;
}

Assistant:

ElementsAddRawTransactionResponseStruct
ElementsTransactionStructApi::AddRawTransaction(  // NOLINT
    const ElementsAddRawTransactionRequestStruct& request) {
  auto call_func = [](const ElementsAddRawTransactionRequestStruct& request)
      -> ElementsAddRawTransactionResponseStruct {  // NOLINT
    ElementsAddRawTransactionResponseStruct response;
    ElementsAddressFactory address_factory;
    // Transaction作成
    std::vector<ConfidentialTxIn> txins;
    std::vector<ConfidentialTxOut> txouts;
    std::vector<TxInPeginParameters> pegins;
    std::vector<TxOutPegoutParameters> pegouts;

    // TxInの追加
    for (const auto& txin_req : request.txins) {
      txins.emplace_back(
          Txid(txin_req.txid), txin_req.vout, txin_req.sequence);
    }

    // add PeginWitness
    for (const auto& txin_req : request.pegin_txins) {
      Txid txid(txin_req.txid);
      txins.emplace_back(txid, txin_req.vout, txin_req.sequence);

      info(
          CFD_LOG_SOURCE, "rm btcWitness[{}]",
          txin_req.is_remove_mainchain_tx_witness);
      TxInPeginParameters pegin_data;
      pegin_data.txid = txid;
      pegin_data.vout = txin_req.vout;
      pegin_data.amount =
          Amount::CreateBySatoshiAmount(txin_req.peginwitness.amount);
      pegin_data.asset = ConfidentialAssetId(txin_req.peginwitness.asset);
      pegin_data.mainchain_blockhash =
          BlockHash(txin_req.peginwitness.mainchain_genesis_block_hash);
      pegin_data.claim_script = Script(txin_req.peginwitness.claim_script);
      pegin_data.mainchain_raw_tx =
          ConfidentialTransaction::GetBitcoinTransaction(
              ByteData(txin_req.peginwitness.mainchain_raw_transaction),
              txin_req.is_remove_mainchain_tx_witness);
      pegin_data.mainchain_txoutproof =
          ByteData(txin_req.peginwitness.mainchain_txoutproof);
      pegins.push_back(pegin_data);
    }

    // TxOutの追加
    Script script;
    for (const auto& txout_req : request.txouts) {
      const std::string& addr = txout_req.address;
      Amount amount(Amount::CreateBySatoshiAmount(txout_req.amount));
      ConfidentialAssetId asset(txout_req.asset);
      if (!txout_req.direct_locking_script.empty()) {
        txouts.emplace_back(
            Script(txout_req.direct_locking_script), asset,
            ConfidentialValue(amount),
            ConfidentialNonce(txout_req.direct_nonce), ByteData(), ByteData());
      } else {
        if (ElementsConfidentialAddress::IsConfidentialAddress(addr)) {
          ElementsConfidentialAddress confidential_addr(addr);
          if (txout_req.is_remove_nonce) {
            txouts.emplace_back(
                confidential_addr.GetUnblindedAddress(), asset, amount);
          } else {
            txouts.emplace_back(confidential_addr, asset, amount);
          }
        } else {
          ConfidentialTxOut txout(
              address_factory.GetAddress(addr), asset, amount);
          txout.SetNonce(ConfidentialNonce(txout_req.direct_nonce));
          txouts.emplace_back(txout);
        }
      }
    }

    for (const auto& destroy_req : request.destroy_amount_txouts) {
      // DestroyのTxOut追加
      ConfidentialTxOut destroy_txout =
          ConfidentialTxOut::CreateDestroyAmountTxOut(
              ConfidentialAssetId(destroy_req.asset),
              Amount::CreateBySatoshiAmount(destroy_req.amount));
      destroy_txout.SetNonce(ConfidentialNonce(destroy_req.direct_nonce));
      txouts.push_back(destroy_txout);
    }

    for (const auto& pegout_req : request.pegout_txouts) {
      // PegoutのTxOut追加
      TxOutPegoutParameters pegout_data;
      pegout_data.amount = Amount::CreateBySatoshiAmount(pegout_req.amount);
      pegout_data.asset = ConfidentialAssetId(pegout_req.asset);
      pegout_data.genesisblock_hash =
          BlockHash(pegout_req.mainchain_genesis_block_hash);
      if (!pegout_req.btc_address.empty()) {
        pegout_data.btc_address = Address(pegout_req.btc_address);
      }
      pegout_data.net_type =
          AddressStructApi::ConvertNetType(pegout_req.network);
      std::string elements_nettype = pegout_req.elements_network;
      if (elements_nettype.empty()) {
        if (pegout_data.net_type == NetType::kMainnet) {
          elements_nettype = "liquidv1";
        } else {
          elements_nettype = "regtest";
        }
      }
      pegout_data.elements_net_type =
          ElementsAddressStructApi::ConvertElementsNetType(elements_nettype);
      if (!pegout_req.online_pubkey.empty() &&
          !pegout_req.master_online_key.empty()) {
        if (pegout_req.master_online_key.size() == Privkey::kPrivkeySize * 2) {
          // hex
          pegout_data.master_online_key =
              Privkey(pegout_req.master_online_key);
        } else {
          // Wif
          pegout_data.master_online_key = Privkey::FromWif(
              pegout_req.master_online_key, pegout_data.net_type);
        }
        pegout_data.online_pubkey = Pubkey(pegout_req.online_pubkey);
        pegout_data.bitcoin_descriptor = pegout_req.bitcoin_descriptor;
        pegout_data.bip32_counter = pegout_req.bip32_counter;
        pegout_data.whitelist = ByteData(pegout_req.whitelist);
      }
      pegouts.push_back(pegout_data);
    }

    // feeの追加
    ConfidentialTxOut txout_fee;
    auto& fee_req = request.fee;
    // amountが0のfeeは無効と判定
    if (fee_req.amount != 0) {
      txout_fee = ConfidentialTxOut(
          ConfidentialAssetId(fee_req.asset),
          Amount::CreateBySatoshiAmount(fee_req.amount));
    }

    std::map<std::string, Amount> pegout_addresses;
    ElementsTransactionApi api;
    ConfidentialTransactionController ctxc = api.AddRawTransaction(
        request.tx, txins, pegins, txouts, pegouts, txout_fee,
        &pegout_addresses);

    // すべて設定後にTxoutのRandomSort
    if (request.is_random_sort_tx_out) {
      ctxc.RandomSortTxOut();
    }

    for (const auto& item : pegout_addresses) {
      if (!item.first.empty()) {
        response.btc_addresses.push_back(item.first);
      }
    }
    response.hex = ctxc.GetHex();
    return response;
  };

  ElementsAddRawTransactionResponseStruct result;
  result = ExecuteStructApi<
      ElementsAddRawTransactionRequestStruct,
      ElementsAddRawTransactionResponseStruct>(
      request, call_func, std::string(__FUNCTION__));
  return result;
}